

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.h
# Opt level: O2

Vector3 * __thiscall Vector3::cross(Vector3 *__return_storage_ptr__,Vector3 *this,Vector3 *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar1 = this->y;
  dVar7 = getZ(v);
  dVar2 = this->z;
  dVar8 = getY(v);
  dVar3 = this->z;
  dVar9 = getX(v);
  dVar4 = this->x;
  dVar10 = getZ(v);
  dVar5 = this->x;
  dVar11 = getY(v);
  dVar6 = this->y;
  dVar12 = getX(v);
  Vector3(__return_storage_ptr__,dVar7 * dVar1 - dVar8 * dVar2,dVar9 * dVar3 - dVar10 * dVar4,
          dVar11 * dVar5 - dVar12 * dVar6);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3 Vector3::cross(const Vector3 &v) const {
    return {y * v.getZ() - z * v.getY(),
            z * v.getX() - x * v.getZ(),
            x * v.getY() - y * v.getX()};
}